

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O3

ssize_t __thiscall MemFile::read(MemFile *this,int __fd,void *__buf,size_t __nbytes)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  int iVar1;
  undefined4 in_register_00000034;
  long lVar2;
  allocator_type local_19;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  __first._M_current = *(uchar **)(lVar2 + 0x58);
  iVar1 = *(int *)(lVar2 + 0x48) - (int)__first._M_current;
  if ((int)__buf <= iVar1) {
    iVar1 = (int)__buf;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,__first,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(__first._M_current + iVar1),&local_19);
  *(long *)(lVar2 + 0x58) = *(long *)(lVar2 + 0x58) + (long)iVar1;
  return (ssize_t)this;
}

Assistant:

std::vector<uint8_t> MemFile::read(int len)
{
    auto avail_bytes = std::min(len, remaining());
    std::vector<uint8_t> data(m_it, m_it + avail_bytes);
    m_it += avail_bytes;
    return data;
}